

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O1

void __thiscall intel_acbp_v1_t::pmsg_body_t::_read(pmsg_body_t *this)

{
  public_key_t *ppVar1;
  signature_t *psVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  public_key_t *this_00;
  signature_t *this_01;
  
  uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_version = uVar3;
  uVar4 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_key_id = uVar4;
  this_00 = (public_key_t *)operator_new(0x48);
  public_key_t::public_key_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
  ppVar1 = (this->m_public_key)._M_t.
           super___uniq_ptr_impl<intel_acbp_v1_t::public_key_t,_std::default_delete<intel_acbp_v1_t::public_key_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v1_t::public_key_t_*,_std::default_delete<intel_acbp_v1_t::public_key_t>_>
           .super__Head_base<0UL,_intel_acbp_v1_t::public_key_t_*,_false>._M_head_impl;
  (this->m_public_key)._M_t.
  super___uniq_ptr_impl<intel_acbp_v1_t::public_key_t,_std::default_delete<intel_acbp_v1_t::public_key_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_intel_acbp_v1_t::public_key_t_*,_std::default_delete<intel_acbp_v1_t::public_key_t>_>
  .super__Head_base<0UL,_intel_acbp_v1_t::public_key_t_*,_false>._M_head_impl = this_00;
  if (ppVar1 != (public_key_t *)0x0) {
    (**(code **)((long)(ppVar1->super_kstruct)._vptr_kstruct + 8))();
  }
  uVar4 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_sig_scheme = uVar4;
  this_01 = (signature_t *)operator_new(0x48);
  signature_t::signature_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
  psVar2 = (this->m_signature)._M_t.
           super___uniq_ptr_impl<intel_acbp_v1_t::signature_t,_std::default_delete<intel_acbp_v1_t::signature_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v1_t::signature_t_*,_std::default_delete<intel_acbp_v1_t::signature_t>_>
           .super__Head_base<0UL,_intel_acbp_v1_t::signature_t_*,_false>._M_head_impl;
  (this->m_signature)._M_t.
  super___uniq_ptr_impl<intel_acbp_v1_t::signature_t,_std::default_delete<intel_acbp_v1_t::signature_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_intel_acbp_v1_t::signature_t_*,_std::default_delete<intel_acbp_v1_t::signature_t>_>
  .super__Head_base<0UL,_intel_acbp_v1_t::signature_t_*,_false>._M_head_impl = this_01;
  if (psVar2 != (signature_t *)0x0) {
    (**(code **)((long)(psVar2->super_kstruct)._vptr_kstruct + 8))();
    return;
  }
  return;
}

Assistant:

void intel_acbp_v1_t::pmsg_body_t::_read() {
    m_version = m__io->read_u1();
    m_key_id = m__io->read_u2le();
    m_public_key = std::unique_ptr<public_key_t>(new public_key_t(m__io, this, m__root));
    m_sig_scheme = m__io->read_u2le();
    m_signature = std::unique_ptr<signature_t>(new signature_t(m__io, this, m__root));
}